

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

void Fra_OneHotEstimateCoverage(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  void **__ptr;
  ulong uVar8;
  Vec_Ptr_t *p_00;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  abctime aVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  iVar17 = p->pManAig->nRegs;
  aVar7 = Abc_Clock();
  uVar1 = (long)iVar17 + 1;
  __ptr = (void **)malloc(uVar1 * 0x10008);
  uVar8 = 0;
  iVar15 = (int)uVar1;
  uVar13 = 0;
  if (0 < iVar15) {
    uVar13 = uVar1 & 0xffffffff;
  }
  lVar14 = (long)iVar17 * 8 + 8;
  for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    __ptr[uVar8] = (void *)((long)__ptr + lVar14);
    lVar14 = lVar14 + 0x10000;
  }
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nSize = iVar15;
  p_00->nCap = iVar15;
  p_00->pArray = __ptr;
  Aig_ManRandom(1);
  iVar15 = 0;
  iVar16 = 0;
  if (0 < iVar17) {
    iVar15 = 0;
    iVar16 = iVar17;
  }
  for (; iVar15 != iVar16; iVar15 = iVar15 + 1) {
    pvVar9 = Vec_PtrEntry(p_00,iVar15);
    for (lVar14 = 0; lVar14 != 0x4000; lVar14 = lVar14 + 1) {
      uVar4 = Aig_ManRandom(0);
      *(uint *)((long)pvVar9 + lVar14 * 4) = uVar4;
    }
  }
  pvVar9 = Vec_PtrEntry(p_00,iVar17);
  uVar4 = 0;
  memset(pvVar9,0,0x10000);
  do {
    if (vOneHots->nSize <= (int)uVar4) {
      iVar17 = 0;
      for (lVar14 = 0; lVar14 != 0x4000; lVar14 = lVar14 + 1) {
        uVar4 = *(uint *)((long)pvVar9 + lVar14 * 4);
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar17 = (uVar4 >> 0x10) + iVar17 + (uVar4 & 0xffff);
      }
      free(__ptr);
      free(p_00);
      printf("Care states ratio = %f. ",(double)(int)(0x80000U - iVar17) * 1.9073486328125e-06);
      iVar15 = 0x8385c0;
      printf("(%d out of %d patterns)  ",(ulong)(0x80000U - iVar17),0x80000);
      Abc_Print(iVar15,"%s =","Time");
      aVar12 = Abc_Clock();
      Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar12 - aVar7) / 1000000.0);
      return;
    }
    uVar5 = Vec_IntEntry(vOneHots,uVar4);
    uVar6 = Vec_IntEntry(vOneHots,uVar4 | 1);
    if (uVar5 != 0 || uVar6 != 0) {
      uVar3 = ~uVar5;
      if (0 < (int)uVar5) {
        uVar3 = uVar5 - 1;
      }
      pvVar10 = Vec_PtrEntry(p_00,uVar3);
      uVar3 = ~uVar6;
      if (0 < (int)uVar6) {
        uVar3 = uVar6 - 1;
      }
      pvVar11 = Vec_PtrEntry(p_00,uVar3);
      if ((int)uVar5 < 0) {
        lVar14 = 0;
        if ((int)uVar6 < 0) {
          for (; lVar14 != 0x4000; lVar14 = lVar14 + 1) {
            puVar2 = (uint *)((long)pvVar9 + lVar14 * 4);
            *puVar2 = *puVar2 | *(uint *)((long)pvVar11 + lVar14 * 4) &
                                *(uint *)((long)pvVar10 + lVar14 * 4);
          }
        }
        else {
          for (; lVar14 != 0x4000; lVar14 = lVar14 + 1) {
            puVar2 = (uint *)((long)pvVar9 + lVar14 * 4);
            *puVar2 = *puVar2 | ~*(uint *)((long)pvVar11 + lVar14 * 4) &
                                *(uint *)((long)pvVar10 + lVar14 * 4);
          }
        }
      }
      else {
        if (-1 < (int)uVar6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                        ,0x175,"void Fra_OneHotEstimateCoverage(Fra_Man_t *, Vec_Int_t *)");
        }
        for (lVar14 = 0; lVar14 != 0x4000; lVar14 = lVar14 + 1) {
          puVar2 = (uint *)((long)pvVar9 + lVar14 * 4);
          *puVar2 = *puVar2 | ~*(uint *)((long)pvVar10 + lVar14 * 4) &
                              *(uint *)((long)pvVar11 + lVar14 * 4);
        }
      }
    }
    uVar4 = uVar4 + 2;
  } while( true );
}

Assistant:

void Fra_OneHotEstimateCoverage( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int nSimWords = (1<<14);
    int nRegs = Aig_ManRegNum(p->pManAig);
    Vec_Ptr_t * vSimInfo;
    unsigned * pSim1, * pSim2, * pSimTot;
    int i, w, Out1, Out2, nCovered, Counter = 0;
    abctime clk = Abc_Clock();

    // generate random sim-info at register outputs
    vSimInfo = Vec_PtrAllocSimInfo( nRegs + 1, nSimWords );
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    for ( i = 0; i < nRegs; i++ )
    {
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, i );
        for ( w = 0; w < nSimWords; w++ )
            pSim1[w] = Fra_ObjRandomSim();
    }
    pSimTot = (unsigned *)Vec_PtrEntry( vSimInfo, nRegs );

    // collect simulation info
    memset( pSimTot, 0, sizeof(unsigned) * nSimWords );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
//printf( "(%c%d,%c%d) ", 
//Fra_LitSign(Out1)? '-': '+', Fra_LitReg(Out1), 
//Fra_LitSign(Out2)? '-': '+', Fra_LitReg(Out2) ); 
        Counter++;
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out1) );
        pSim2 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out2) );
        if ( Fra_LitSign(Out1) && Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] &  pSim2[w];
        else if ( Fra_LitSign(Out1) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] & ~pSim2[w];
        else if ( Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |= ~pSim1[w] &  pSim2[w];
        else
            assert( 0 );
    }
//printf( "\n" );
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nSimWords; w++ )
        nCovered += Aig_WordCountOnes( pSimTot[w] );
    Vec_PtrFree( vSimInfo );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nSimWords * 32 - nCovered) / (nSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nSimWords * 32 - nCovered, nSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}